

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitObjectInitializers
               (ParseNode *memberList,RegSlot objectLocation,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo)

{
  ParseNode *this;
  RegSlot destinationRegister;
  bool bVar1;
  BOOL BVar2;
  uint C1;
  uint32 byteCount;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar3;
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  ArenaAllocator *pAVar4;
  ParseNodeBin *pPVar5;
  ParseNodeStr *pPVar6;
  ScriptContext *pSVar7;
  ByteCodeWriter *pBVar8;
  PropertyIdArray *pPVar9;
  FunctionBody *this_01;
  ParseNode *memberNode;
  uint uStack_d0;
  bool useStore;
  uint32 literalObjectId;
  uint argIndex;
  undefined8 local_c0;
  TrackAllocData local_b8;
  PropertyIdArray *local_90;
  PropertyIdArray *propIds;
  uint32 allocSize;
  bool hasComputedNameOrSpread;
  undefined8 local_78;
  TrackAllocData local_70;
  BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_48;
  PropertyIdSet *propertyIds;
  uint32 local_38;
  PropertyId propertyId;
  uint32 value;
  uint argCount;
  ParseNode *pmemberList;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodePtr pPStack_10;
  RegSlot objectLocation_local;
  ParseNode *memberList_local;
  
  propertyId = 0;
  _value = memberList;
  pmemberList = (ParseNode *)funcInfo;
  funcInfo_local = (FuncInfo *)byteCodeGenerator;
  byteCodeGenerator_local._4_4_ = objectLocation;
  pPStack_10 = memberList;
  pAVar3 = &ByteCodeGenerator::GetAllocator(byteCodeGenerator)->
            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,
             (type_info *)
             &JsUtil::
              BaseHashSet<int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
              ::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
             ,0x2297);
  pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar3,&local_70);
  _allocSize = Memory::ArenaAllocator::Alloc;
  local_78 = 0;
  this_00 = (BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             *)new<Memory::ArenaAllocator>(0x38,(ArenaAllocator *)pAVar3,0x3f67b0);
  pAVar4 = ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local);
  JsUtil::
  BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  ::BaseHashSet((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 *)this_00,pAVar4,0x11);
  propIds._7_1_ = 0;
  local_48 = this_00;
  if (pPStack_10 != (ParseNode *)0x0) {
    while (pPStack_10->nop == knopList) {
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      if (pPVar5->pnode1->nop == knopEllipsis) {
LAB_00b4cd66:
        propIds._7_1_ = 1;
        break;
      }
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      pPVar5 = ParseNode::AsParseNodeBin(pPVar5->pnode1);
      if (pPVar5->pnode1->nop == knopComputedName) goto LAB_00b4cd66;
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      pPVar5 = ParseNode::AsParseNodeBin(pPVar5->pnode1);
      pPVar6 = ParseNode::AsParseNodeStr(pPVar5->pnode1);
      propertyIds._4_4_ = Ident::GetPropertyId(pPVar6->pid);
      pSVar7 = ByteCodeGenerator::GetScriptContext((ByteCodeGenerator *)funcInfo_local);
      BVar2 = Js::ScriptContext::IsNumericPropertyId(pSVar7,propertyIds._4_4_,&local_38);
      if (BVar2 == 0) {
        JsUtil::
        BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Item((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)local_48,(int *)((long)&propertyIds + 4));
      }
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      pPStack_10 = pPVar5->pnode2;
    }
    if (((pPStack_10->nop != knopEllipsis) &&
        (pPVar5 = ParseNode::AsParseNodeBin(pPStack_10), pPVar5->pnode1->nop != knopComputedName))
       && ((propIds._7_1_ & 1) == 0)) {
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      pPVar6 = ParseNode::AsParseNodeStr(pPVar5->pnode1);
      propertyIds._4_4_ = Ident::GetPropertyId(pPVar6->pid);
      pSVar7 = ByteCodeGenerator::GetScriptContext((ByteCodeGenerator *)funcInfo_local);
      BVar2 = Js::ScriptContext::IsNumericPropertyId(pSVar7,propertyIds._4_4_,&local_38);
      if (BVar2 == 0) {
        JsUtil::
        BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Item((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                *)local_48,(int *)((long)&propertyIds + 4));
      }
    }
  }
  propertyId = JsUtil::
               BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               ::Count((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                        *)local_48);
  pPStack_10 = _value;
  if ((_value == (ParseNode *)0x0) || (propertyId == 0)) {
    pBVar8 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    Js::ByteCodeWriter::Reg1(pBVar8,NewScObjectSimple,byteCodeGenerator_local._4_4_);
  }
  else {
    propIds._0_4_ = UInt32Math::Mul(propertyId,4);
    pAVar3 = &ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_b8,(type_info *)&Js::PropertyIdArray::typeinfo,(ulong)(uint32)propIds,
               0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
               ,0x22c2);
    pAVar3 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo(pAVar3,&local_b8);
    _argIndex = Memory::ArenaAllocator::Alloc;
    local_c0 = 0;
    pPVar9 = (PropertyIdArray *)new<Memory::ArenaAllocator>(8,(ArenaAllocator *)pAVar3,0x3f67b0,0);
    Js::PropertyIdArray::PropertyIdArray(pPVar9,propertyId,'\0',false,false,false);
    literalObjectId = 0x1eb;
    local_90 = pPVar9;
    bVar1 = JsUtil::
            BaseDictionary<int,_int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
            ::ContainsKey(local_48,(int *)&literalObjectId);
    if (bVar1) {
      local_90->has__proto__ = true;
    }
    uStack_d0 = 0;
    while ((pPStack_10->nop == knopList &&
           (pPVar5 = ParseNode::AsParseNodeBin(pPStack_10), pPVar5->pnode1->nop != knopEllipsis))) {
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      pPVar5 = ParseNode::AsParseNodeBin(pPVar5->pnode1);
      if (pPVar5->pnode1->nop == knopComputedName) break;
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      pPVar5 = ParseNode::AsParseNodeBin(pPVar5->pnode1);
      pPVar6 = ParseNode::AsParseNodeStr(pPVar5->pnode1);
      propertyIds._4_4_ = Ident::GetPropertyId(pPVar6->pid);
      pSVar7 = ByteCodeGenerator::GetScriptContext((ByteCodeGenerator *)funcInfo_local);
      BVar2 = Js::ScriptContext::IsNumericPropertyId(pSVar7,propertyIds._4_4_,&local_38);
      if ((BVar2 == 0) &&
         (bVar1 = JsUtil::
                  BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::Remove((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                            *)local_48,(int *)((long)&propertyIds + 4)), bVar1)) {
        (&local_90[1].count)[uStack_d0] = propertyIds._4_4_;
        uStack_d0 = uStack_d0 + 1;
      }
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      pPStack_10 = pPVar5->pnode2;
    }
    if (((pPStack_10->nop != knopEllipsis) &&
        (pPVar5 = ParseNode::AsParseNodeBin(pPStack_10), pPVar5->pnode1->nop != knopComputedName))
       && ((propIds._7_1_ & 1) == 0)) {
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      pPVar6 = ParseNode::AsParseNodeStr(pPVar5->pnode1);
      propertyIds._4_4_ = Ident::GetPropertyId(pPVar6->pid);
      pSVar7 = ByteCodeGenerator::GetScriptContext((ByteCodeGenerator *)funcInfo_local);
      BVar2 = Js::ScriptContext::IsNumericPropertyId(pSVar7,propertyIds._4_4_,&local_38);
      if ((BVar2 == 0) &&
         (bVar1 = JsUtil::
                  BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  ::Remove((BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                            *)local_48,(int *)((long)&propertyIds + 4)), bVar1)) {
        (&local_90[1].count)[uStack_d0] = propertyIds._4_4_;
      }
    }
    this_01 = FuncInfo::GetParsedFunctionBody((FuncInfo *)pmemberList);
    C1 = Js::FunctionBody::NewObjectLiteral(this_01);
    pBVar8 = ByteCodeGenerator::Writer((ByteCodeGenerator *)funcInfo_local);
    destinationRegister = byteCodeGenerator_local._4_4_;
    pPVar9 = local_90;
    byteCount = UInt32Math::Add(8,(uint32)propIds);
    Js::ByteCodeWriter::Auxiliary(pBVar8,NewScObjectLiteral,destinationRegister,pPVar9,byteCount,C1)
    ;
    pAVar4 = ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BaseHashSet<int,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,int,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>>
              (pAVar4,(BaseHashSet<int,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_int,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                       *)local_48);
    pAVar4 = ByteCodeGenerator::GetAllocator((ByteCodeGenerator *)funcInfo_local);
    Memory::DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::PropertyIdArray>
              (pAVar4,local_90,(ulong)(uint32)propIds);
  }
  pPStack_10 = _value;
  memberNode._3_1_ = false;
  if (_value != (ParseNode *)0x0) {
    while (pPStack_10->nop == knopList) {
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      this = pPVar5->pnode1;
      if (this->nop == knopEllipsis) {
        ByteCodeGenerator::StartSubexpression((ByteCodeGenerator *)funcInfo_local,this);
        EmitObjectSpreadNode
                  (this,byteCodeGenerator_local._4_4_,(ByteCodeGenerator *)funcInfo_local,
                   (FuncInfo *)pmemberList);
        ByteCodeGenerator::EndSubexpression((ByteCodeGenerator *)funcInfo_local,this);
      }
      else {
        pPVar5 = ParseNode::AsParseNodeBin(this);
        if (pPVar5->pnode1->nop == knopComputedName) {
          memberNode._3_1_ = true;
        }
        ByteCodeGenerator::StartSubexpression((ByteCodeGenerator *)funcInfo_local,this);
        EmitMemberNode(this,byteCodeGenerator_local._4_4_,(ByteCodeGenerator *)funcInfo_local,
                       (FuncInfo *)pmemberList,(ParseNode *)0x0,memberNode._3_1_,(bool *)0x0);
        ByteCodeGenerator::EndSubexpression((ByteCodeGenerator *)funcInfo_local,this);
      }
      pPVar5 = ParseNode::AsParseNodeBin(pPStack_10);
      pPStack_10 = pPVar5->pnode2;
    }
    ByteCodeGenerator::StartSubexpression((ByteCodeGenerator *)funcInfo_local,pPStack_10);
    if (pPStack_10->nop == knopEllipsis) {
      EmitObjectSpreadNode
                (pPStack_10,byteCodeGenerator_local._4_4_,(ByteCodeGenerator *)funcInfo_local,
                 (FuncInfo *)pmemberList);
    }
    else {
      EmitMemberNode(pPStack_10,byteCodeGenerator_local._4_4_,(ByteCodeGenerator *)funcInfo_local,
                     (FuncInfo *)pmemberList,(ParseNode *)0x0,memberNode._3_1_,(bool *)0x0);
    }
    ByteCodeGenerator::EndSubexpression((ByteCodeGenerator *)funcInfo_local,pPStack_10);
  }
  return;
}

Assistant:

void EmitObjectInitializers(ParseNode *memberList, Js::RegSlot objectLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    ParseNode *pmemberList = memberList;
    unsigned int argCount = 0;
    uint32  value;
    Js::PropertyId propertyId;

    //
    // 1. Add all non-int property ids to a dictionary propertyIds with value true
    // 2. Get the count of propertyIds
    // 3. Create a propertyId array of size count
    // 4. Put the propIds in the auxiliary area
    // 5. Get the objectLiteralCacheId
    // 6. Generate propId inits with values
    //

    // Handle propertyId collision
    typedef JsUtil::BaseHashSet<Js::PropertyId, ArenaAllocator, PowerOf2SizePolicy> PropertyIdSet;
    PropertyIdSet* propertyIds = Anew(byteCodeGenerator->GetAllocator(), PropertyIdSet, byteCodeGenerator->GetAllocator(), 17);

    bool hasComputedNameOrSpread = false;
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            if (memberList->AsParseNodeBin()->pnode1->nop == knopEllipsis || memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->nop == knopComputedName)
            {
                hasComputedNameOrSpread = true;
                break;
            }

            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value))
            {
                propertyIds->Item(propertyId);
            }

            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        if (memberList->nop != knopEllipsis && memberList->AsParseNodeBin()->pnode1->nop != knopComputedName && !hasComputedNameOrSpread)
        {
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value))
            {
                propertyIds->Item(propertyId);
            }
        }
    }

    argCount = propertyIds->Count();

    memberList = pmemberList;
    if ((memberList == nullptr) || (argCount == 0))
    {
        // Empty literal or numeric property only object literal
        byteCodeGenerator->Writer()->Reg1(Js::OpCode::NewScObjectSimple, objectLocation);
    }
    else
    {
        uint32 allocSize = UInt32Math::Mul(argCount, sizeof(Js::PropertyId));
        Js::PropertyIdArray *propIds = AnewPlus(byteCodeGenerator->GetAllocator(), allocSize, Js::PropertyIdArray, argCount, 0);

        if (propertyIds->ContainsKey(Js::PropertyIds::__proto__))
        {
            // Always record whether the initializer contains __proto__ no matter if current environment has it enabled
            // or not, in case the bytecode is later run with __proto__ enabled.
            propIds->has__proto__ = true;
        }

        unsigned int argIndex = 0;
        while (memberList->nop == knopList)
        {
            if (memberList->AsParseNodeBin()->pnode1->nop == knopEllipsis || memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->nop == knopComputedName)
            {
                break;
            }
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value) && propertyIds->Remove(propertyId))
            {
                propIds->elements[argIndex] = propertyId;
                argIndex++;
            }
            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        if (memberList->nop != knopEllipsis && memberList->AsParseNodeBin()->pnode1->nop != knopComputedName && !hasComputedNameOrSpread)
        {
            propertyId = memberList->AsParseNodeBin()->pnode1->AsParseNodeStr()->pid->GetPropertyId();
            if (!byteCodeGenerator->GetScriptContext()->IsNumericPropertyId(propertyId, &value) && propertyIds->Remove(propertyId))
            {
                propIds->elements[argIndex] = propertyId;
                argIndex++;
            }
        }

        uint32 literalObjectId = funcInfo->GetParsedFunctionBody()->NewObjectLiteral();

        // Generate the opcode with propIds and cacheId
        byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::NewScObjectLiteral, objectLocation, propIds, UInt32Math::Add(sizeof(Js::PropertyIdArray), allocSize), literalObjectId);

        Adelete(byteCodeGenerator->GetAllocator(), propertyIds);

        AdeletePlus(byteCodeGenerator->GetAllocator(), allocSize, propIds);
    }

    memberList = pmemberList;

    bool useStore = false;
    // Generate the actual assignment to those properties
    if (memberList != nullptr)
    {
        while (memberList->nop == knopList)
        {
            ParseNode *memberNode = memberList->AsParseNodeBin()->pnode1;
            if (memberNode->nop == knopEllipsis) 
            {
                byteCodeGenerator->StartSubexpression(memberNode);
                EmitObjectSpreadNode(memberNode, objectLocation, byteCodeGenerator, funcInfo);
                byteCodeGenerator->EndSubexpression(memberNode);
            }
            else
            {
                if (memberNode->AsParseNodeBin()->pnode1->nop == knopComputedName)
                {
                    useStore = true;
                }

                byteCodeGenerator->StartSubexpression(memberNode);
                EmitMemberNode(memberNode, objectLocation, byteCodeGenerator, funcInfo, nullptr, useStore);
                byteCodeGenerator->EndSubexpression(memberNode);
            }
            memberList = memberList->AsParseNodeBin()->pnode2;
        }

        byteCodeGenerator->StartSubexpression(memberList);
        if (memberList->nop == knopEllipsis)
        {
            EmitObjectSpreadNode(memberList, objectLocation, byteCodeGenerator, funcInfo);
        }
        else
        {
            EmitMemberNode(memberList, objectLocation, byteCodeGenerator, funcInfo, nullptr, useStore);
        }
        byteCodeGenerator->EndSubexpression(memberList);
    }
}